

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

void * amqp_simple_rpc_decoded
                 (amqp_connection_state_t state,amqp_channel_t channel,
                 amqp_method_number_t request_id,amqp_method_number_t reply_id,
                 void *decoded_request_method)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined2 in_SI;
  long in_RDI;
  amqp_time_t unaff_retaddr;
  amqp_method_number_t replies [2];
  int res;
  amqp_time_t deadline;
  timeval *in_stack_ffffffffffffff80;
  amqp_time_t *in_stack_ffffffffffffff88;
  undefined8 local_70;
  undefined8 local_68;
  amqp_rpc_reply_t local_60;
  undefined4 local_38;
  amqp_status_enum local_34;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffec;
  long lVar1;
  amqp_connection_state_t in_stack_fffffffffffffff8;
  void *pvVar2;
  
  local_34 = amqp_time_from_now(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (local_34 == AMQP_STATUS_OK) {
    local_38 = 0;
    lVar1 = in_RDI;
    simple_rpc_inner(in_stack_fffffffffffffff8,(amqp_channel_t)((ulong)in_RDI >> 0x30),
                     (amqp_method_number_t)in_RDI,
                     (amqp_method_number_t *)
                     CONCAT26(in_SI,CONCAT24(in_stack_ffffffffffffffec,in_EDX)),
                     (void *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),unaff_retaddr);
    *(timeval **)(in_RDI + 0x110) = in_stack_ffffffffffffff80;
    *(amqp_time_t **)(in_RDI + 0x118) = in_stack_ffffffffffffff88;
    *(undefined8 *)(in_RDI + 0x120) = local_70;
    *(undefined8 *)(in_RDI + 0x128) = local_68;
    if (*(int *)(lVar1 + 0x110) == 1) {
      pvVar2 = *(void **)(lVar1 + 0x120);
    }
    else {
      pvVar2 = (void *)0x0;
    }
  }
  else {
    amqp_rpc_reply_error(&local_60,local_34);
    *(undefined8 *)(in_RDI + 0x110) = local_60._0_8_;
    *(undefined8 *)(in_RDI + 0x118) = local_60.reply._0_8_;
    *(void **)(in_RDI + 0x120) = local_60.reply.decoded;
    *(undefined8 *)(in_RDI + 0x128) = local_60._24_8_;
    pvVar2 = (void *)0x0;
  }
  return pvVar2;
}

Assistant:

void *amqp_simple_rpc_decoded(amqp_connection_state_t state,
                              amqp_channel_t channel,
                              amqp_method_number_t request_id,
                              amqp_method_number_t reply_id,
                              void *decoded_request_method) {
  amqp_time_t deadline;
  int res;
  amqp_method_number_t replies[2];

  res = amqp_time_from_now(&deadline, state->rpc_timeout);
  if (res != AMQP_STATUS_OK) {
    state->most_recent_api_result = amqp_rpc_reply_error(res);
    return NULL;
  }

  replies[0] = reply_id;
  replies[1] = 0;

  state->most_recent_api_result = simple_rpc_inner(
      state, channel, request_id, replies, decoded_request_method, deadline);

  if (state->most_recent_api_result.reply_type == AMQP_RESPONSE_NORMAL) {
    return state->most_recent_api_result.reply.decoded;
  } else {
    return NULL;
  }
}